

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Hpipe::Context::Context(Context *this,CharItem *item,int flags)

{
  _Rb_tree_header *p_Var1;
  CharItem *local_20;
  
  p_Var1 = &(this->paths_to_strings)._M_t._M_impl.super__Rb_tree_header;
  (this->paths_to_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->paths_to_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->pos).super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pos).super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->paths_to_mark).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->pos).super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
  super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mark = (InstructionMark *)0x0;
  (this->paths_to_mark).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->paths_to_mark).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->paths_to_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->paths_to_strings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->paths_to_strings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->flags = flags;
  local_20 = item;
  std::vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>>::
  emplace_back<Hpipe::CharItem_const*const&>
            ((vector<Hpipe::CharItem_const*,std::allocator<Hpipe::CharItem_const*>> *)this,&local_20
            );
  return;
}

Assistant:

Context::Context( const CharItem *item, int flags ) : flags( flags ), mark( 0 ) {
    pos << item;
}